

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void windowCheckValue(Parse *pParse,int reg,int eCond)

{
  Op *pOVar1;
  byte bVar2;
  int iVar3;
  Vdbe *p;
  Parse *pPVar4;
  int p2;
  int iVar5;
  
  p = sqlite3GetVdbe(pParse);
  if (pParse->nTempReg == '\0') {
    p2 = pParse->nMem + 1;
    pParse->nMem = p2;
  }
  else {
    bVar2 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar2;
    p2 = pParse->aTempReg[bVar2];
  }
  sqlite3VdbeAddOp3(p,0x47,0,p2,0);
  if (eCond < 3) {
    sqlite3VdbeAddOp3(p,0xd,reg,p->nOp + 2,0);
  }
  else {
    if (pParse->nTempReg == '\0') {
      iVar5 = pParse->nMem + 1;
      pParse->nMem = iVar5;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar5 = pParse->aTempReg[bVar2];
    }
    iVar3 = sqlite3VdbeAddOp3(p,0x75,0,iVar5,0);
    sqlite3VdbeChangeP4(p,iVar3,"",-1);
    sqlite3VdbeAddOp3(p,0x39,iVar5,p->nOp + 2,reg);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x53;
    }
  }
  sqlite3VdbeAddOp3(p,windowCheckValue::aOp[(uint)eCond],p2,p->nOp + 2,reg);
  if (0 < (long)p->nOp) {
    p->aOp[(long)p->nOp + -1].p5 = 0x43;
  }
  pPVar4 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar4 = pParse;
  }
  pPVar4->mayAbort = '\x01';
  sqlite3VdbeAddOp3(p,0x46,1,2,0);
  if (p->db->mallocFailed == '\0') {
    iVar5 = *(int *)(windowCheckValue_azErr_rel + (ulong)(uint)eCond * 4);
    pOVar1 = p->aOp;
    iVar3 = p->nOp;
    pOVar1[(long)iVar3 + -1].p4type = -1;
    pOVar1[(long)iVar3 + -1].p4.p = windowCheckValue_azErr_rel + iVar5;
  }
  if (p2 != 0) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = p2;
    }
  }
  return;
}

Assistant:

static void windowCheckValue(Parse *pParse, int reg, int eCond){
  static const char *azErr[] = {
    "frame starting offset must be a non-negative integer",
    "frame ending offset must be a non-negative integer",
    "second argument to nth_value must be a positive integer",
    "frame starting offset must be a non-negative number",
    "frame ending offset must be a non-negative number",
  };
  static int aOp[] = { OP_Ge, OP_Ge, OP_Gt, OP_Ge, OP_Ge };
  Vdbe *v = sqlite3GetVdbe(pParse);
  int regZero = sqlite3GetTempReg(pParse);
  assert( eCond>=0 && eCond<ArraySize(azErr) );
  sqlite3VdbeAddOp2(v, OP_Integer, 0, regZero);
  if( eCond>=WINDOW_STARTING_NUM ){
    int regString = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp4(v, OP_String8, 0, regString, 0, "", P4_STATIC);
    sqlite3VdbeAddOp3(v, OP_Ge, regString, sqlite3VdbeCurrentAddr(v)+2, reg);
    sqlite3VdbeChangeP5(v, SQLITE_AFF_NUMERIC|SQLITE_JUMPIFNULL);
    VdbeCoverage(v);
    assert( eCond==3 || eCond==4 );
    VdbeCoverageIf(v, eCond==3);
    VdbeCoverageIf(v, eCond==4);
  }else{
    sqlite3VdbeAddOp2(v, OP_MustBeInt, reg, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    assert( eCond==0 || eCond==1 || eCond==2 );
    VdbeCoverageIf(v, eCond==0);
    VdbeCoverageIf(v, eCond==1);
    VdbeCoverageIf(v, eCond==2);
  }
  sqlite3VdbeAddOp3(v, aOp[eCond], regZero, sqlite3VdbeCurrentAddr(v)+2, reg);
  sqlite3VdbeChangeP5(v, SQLITE_AFF_NUMERIC);
  VdbeCoverageNeverNullIf(v, eCond==0); /* NULL case captured by */
  VdbeCoverageNeverNullIf(v, eCond==1); /*   the OP_MustBeInt */
  VdbeCoverageNeverNullIf(v, eCond==2);
  VdbeCoverageNeverNullIf(v, eCond==3); /* NULL case caught by */
  VdbeCoverageNeverNullIf(v, eCond==4); /*   the OP_Ge */
  sqlite3MayAbort(pParse);
  sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_ERROR, OE_Abort);
  sqlite3VdbeAppendP4(v, (void*)azErr[eCond], P4_STATIC);
  sqlite3ReleaseTempReg(pParse, regZero);
}